

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O0

size_t __thiscall
SGParser::Generator::Grammar::CreateTerminalVector
          (Grammar *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *pterminalVec,Lex *lex)

{
  type *ptVar1;
  bool bVar2;
  size_type sVar3;
  reference puVar4;
  const_reference __x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  type *local_78;
  type *prod;
  type *str;
  _Self local_60;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *__range2_1;
  const_iterator cStack_40;
  uint lexeme;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  Lex *lex_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pterminalVec_local;
  Grammar *this_local;
  
  sVar3 = std::vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>::size(&lex->Lexemes);
  if (sVar3 == 0) {
    this_local = (Grammar *)0x0;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(pterminalVec);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[11]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pterminalVec,
               (char (*) [11])"TokenError");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pterminalVec,
               (char (*) [9])"TokenEOF");
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&lex->TokenLexemes);
    cStack_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&lex->TokenLexemes);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0);
      if (!bVar2) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      __x = std::vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>::operator[]
                      (&lex->Lexemes,(ulong)*puVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pterminalVec,&__x->Name);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::begin(&this->GrammarSymbols);
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::end(&this->GrammarSymbols);
    while( true ) {
      bVar2 = std::operator!=(&__end2_1,&local_60);
      if (!bVar2) break;
      str = &std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
             ::operator*(&__end2_1)->first;
      prod = (type *)std::get<0ul,std::__cxx11::string_const,unsigned_int>
                               ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                                 *)str);
      local_78 = std::get<1ul,std::__cxx11::string_const,unsigned_int>
                           ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                             *)str);
      ptVar1 = prod;
      if ((*local_78 & 0x40000000) != 0) {
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&local_b8,(ulong)ptVar1);
        std::operator+(&local_98,"TokenError_",&local_b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pterminalVec,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
      ::operator++(&__end2_1);
    }
    this_local = (Grammar *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(pterminalVec);
  }
  return (size_t)this_local;
}

Assistant:

size_t Grammar::CreateTerminalVector(std::vector<String>& pterminalVec, const Lex& lex) const {
    // Make sure there are lexemes to deal with
    if (lex.Lexemes.size() == 0u)
        return 0u;

    // Make sure the std::vector is empty
    pterminalVec.clear();

    // Add the hard-coded default terminals
    pterminalVec.emplace_back("TokenError");
    pterminalVec.emplace_back("TokenEOF");

    // Add all the lexemes
    for (const auto lexeme: lex.TokenLexemes)
        pterminalVec.push_back(lex.Lexemes[lexeme].Name);

    // Go through grammar symbols and save the named error terminals
    for (const auto& [str, prod]: GrammarSymbols)
        if (prod & ProductionMask::ErrorTerminal)
            pterminalVec.push_back("TokenError_" + str.substr(6u, str.size() - 7u));

    return pterminalVec.size();
}